

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_undo_canvas_apply(_glist *x,void *z,int action)

{
  t_float tVar1;
  t_float tVar2;
  t_float tVar3;
  t_float tVar4;
  ushort uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  t_undo_canvas_properties tmp;
  t_undo_canvas_properties *buf;
  int action_local;
  void *z_local;
  _glist *x_local;
  
  if ((action == 1) || (action == 2)) {
    if ((*(ushort *)&x->field_0xe8 >> 5 & 1) == 0) {
      canvas_editmode(x,1.0);
    }
    iVar15 = x->gl_pixwidth;
    iVar8 = x->gl_pixheight;
    tVar1 = x->gl_x1;
    tVar2 = x->gl_y1;
    tVar3 = x->gl_x2;
    tVar4 = x->gl_y2;
    iVar9 = x->gl_screenx1;
    iVar10 = x->gl_screeny1;
    iVar11 = x->gl_screenx2;
    iVar12 = x->gl_screeny2;
    iVar13 = x->gl_xmargin;
    iVar14 = x->gl_ymargin;
    uVar5 = *(ushort *)&x->field_0xe8;
    uVar6 = *(undefined2 *)&x->field_0xe8;
    uVar7 = *(undefined2 *)&x->field_0xe8;
    x->gl_pixwidth = *z;
    x->gl_pixheight = *(int *)((long)z + 4);
    x->gl_x1 = *(t_float *)((long)z + 8);
    x->gl_y1 = *(t_float *)((long)z + 0xc);
    x->gl_x2 = *(t_float *)((long)z + 0x10);
    x->gl_y2 = *(t_float *)((long)z + 0x14);
    x->gl_screenx1 = *(int *)((long)z + 0x18);
    x->gl_screeny1 = *(int *)((long)z + 0x1c);
    x->gl_screenx2 = *(int *)((long)z + 0x20);
    x->gl_screeny2 = *(int *)((long)z + 0x24);
    x->gl_xmargin = *(int *)((long)z + 0x28);
    x->gl_ymargin = *(int *)((long)z + 0x2c);
    *(ushort *)&x->field_0xe8 =
         *(ushort *)&x->field_0xe8 & 0xff7f | (ushort)(*(byte *)((long)z + 0x30) & 1) << 7;
    *(ushort *)&x->field_0xe8 =
         *(ushort *)&x->field_0xe8 & 0xfeff | (ushort)(*(byte *)((long)z + 0x30) >> 1 & 1) << 8;
    *(ushort *)&x->field_0xe8 =
         *(ushort *)&x->field_0xe8 & 0xfdff | (ushort)(*(byte *)((long)z + 0x30) >> 2 & 1) << 9;
    *(int *)z = iVar15;
    *(int *)((long)z + 4) = iVar8;
    *(t_float *)((long)z + 8) = tVar1;
    *(t_float *)((long)z + 0xc) = tVar2;
    *(t_float *)((long)z + 0x10) = tVar3;
    *(t_float *)((long)z + 0x14) = tVar4;
    *(int *)((long)z + 0x18) = iVar9;
    *(int *)((long)z + 0x1c) = iVar10;
    *(int *)((long)z + 0x20) = iVar11;
    *(int *)((long)z + 0x24) = iVar12;
    *(int *)((long)z + 0x28) = iVar13;
    *(int *)((long)z + 0x2c) = iVar14;
    *(byte *)((long)z + 0x30) = *(byte *)((long)z + 0x30) & 0xfe | (byte)(uVar5 >> 7) & 1;
    *(byte *)((long)z + 0x30) =
         *(byte *)((long)z + 0x30) & 0xfd | ((byte)((ushort)uVar6 >> 8) & 1) << 1;
    *(byte *)((long)z + 0x30) =
         *(byte *)((long)z + 0x30) & 0xfb | ((byte)((ushort)uVar7 >> 9) & 1) << 2;
    canvas_setgraph(x,(uint)(*(ushort *)&x->field_0xe8 >> 8 & 1) +
                      (uint)(*(ushort *)&x->field_0xe8 >> 9 & 1) * 2,0);
    canvas_dirty(x,1.0);
    if ((*(ushort *)&x->field_0xe8 & 1) != 0) {
      canvas_redraw(x);
    }
    if (((x->gl_owner != (_glist *)0x0) && ((*(ushort *)&x->field_0xe8 >> 0xb & 1) == 0)) &&
       (iVar15 = glist_isvisible(x->gl_owner), iVar15 != 0)) {
      glist_noselect(x);
      gobj_vis((t_gobj *)x,x->gl_owner,0);
      gobj_vis((t_gobj *)x,x->gl_owner,1);
      if ((*(ushort *)&x->gl_owner->field_0xe8 & 1) != 0) {
        canvas_redraw(x->gl_owner);
      }
    }
  }
  else if ((action == 0) && (z != (void *)0x0)) {
    freebytes(z,0x34);
  }
  return 1;
}

Assistant:

int canvas_undo_canvas_apply(t_canvas *x, void *z, int action)
{
    t_undo_canvas_properties *buf = (t_undo_canvas_properties *)z;
    t_undo_canvas_properties tmp;

    if (action == UNDO_UNDO || action == UNDO_REDO)
    {
        if (!x->gl_edit)
            canvas_editmode(x, 1);
#if 0
            /* close properties window first */
        t_int properties = gfxstub_haveproperties((void *)x);
        if (properties)
        {
            pdgui_stub_deleteforkey(x);
        }
#endif
            /* store current canvas values into temporary data holder */
        tmp.gl_pixwidth = x->gl_pixwidth;
        tmp.gl_pixheight = x->gl_pixheight;
        tmp.gl_x1 = x->gl_x1;
        tmp.gl_y1 = x->gl_y1;
        tmp.gl_x2 = x->gl_x2;
        tmp.gl_y2 = x->gl_y2;
        tmp.gl_screenx1 = x->gl_screenx1;
        tmp.gl_screeny1 = x->gl_screeny1;
        tmp.gl_screenx2 = x->gl_screenx2;
        tmp.gl_screeny2 = x->gl_screeny2;
        tmp.gl_xmargin = x->gl_xmargin;
        tmp.gl_ymargin = x->gl_ymargin;
        tmp.gl_goprect = x->gl_goprect;
        tmp.gl_isgraph = x->gl_isgraph;
        tmp.gl_hidetext = x->gl_hidetext;

            /* change canvas values with the ones from the undo buffer */
        x->gl_pixwidth = buf->gl_pixwidth;
        x->gl_pixheight = buf->gl_pixheight;
        x->gl_x1 = buf->gl_x1;
        x->gl_y1 = buf->gl_y1;
        x->gl_x2 = buf->gl_x2;
        x->gl_y2 = buf->gl_y2;
        x->gl_screenx1 = buf->gl_screenx1;
        x->gl_screeny1 = buf->gl_screeny1;
        x->gl_screenx2 = buf->gl_screenx2;
        x->gl_screeny2 = buf->gl_screeny2;
        x->gl_xmargin = buf->gl_xmargin;
        x->gl_ymargin = buf->gl_ymargin;
        x->gl_goprect = buf->gl_goprect;
        x->gl_isgraph = buf->gl_isgraph;
        x->gl_hidetext = buf->gl_hidetext;

            /* copy data values from the temporary data to the undo buffer */
        buf->gl_pixwidth = tmp.gl_pixwidth;
        buf->gl_pixheight = tmp.gl_pixheight;
        buf->gl_x1 = tmp.gl_x1;
        buf->gl_y1 = tmp.gl_y1;
        buf->gl_x2 = tmp.gl_x2;
        buf->gl_y2 = tmp.gl_y2;
        buf->gl_screenx1 = tmp.gl_screenx1;
        buf->gl_screeny1 = tmp.gl_screeny1;
        buf->gl_screenx2 = tmp.gl_screenx2;
        buf->gl_screeny2 = tmp.gl_screeny2;
        buf->gl_xmargin = tmp.gl_xmargin;
        buf->gl_ymargin = tmp.gl_ymargin;
        buf->gl_goprect = tmp.gl_goprect;
        buf->gl_isgraph = tmp.gl_isgraph;
        buf->gl_hidetext = tmp.gl_hidetext;

            /* redraw */
        canvas_setgraph(x, x->gl_isgraph + 2*x->gl_hidetext, 0);
        canvas_dirty(x, 1);

        if (x->gl_havewindow)
        {
            canvas_redraw(x);
        }
        if (x->gl_owner && !x->gl_isclone && glist_isvisible(x->gl_owner))
        {
            glist_noselect(x);
            gobj_vis(&x->gl_gobj, x->gl_owner, 0);
            gobj_vis(&x->gl_gobj, x->gl_owner, 1);
            if (x->gl_owner->gl_havewindow)
                canvas_redraw(x->gl_owner);
        }
    }

    else if (action == UNDO_FREE)
    {
        if (buf)
            t_freebytes(buf, sizeof(*buf));
    }
    return 1;
}